

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O2

ostream * es::init::operator<<(ostream *os,singletons_meta_data *md)

{
  ostream *poVar1;
  char *pcVar2;
  
  poVar1 = std::operator<<(os,"singleton meta data: ");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  poVar1 = std::operator<<(poVar1," p: ");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  poVar1 = std::operator<<(poVar1," init count: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," flags: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," func name: ");
  pcVar2 = "\'\'";
  if (md->_func_name != (char *)0x0) {
    pcVar2 = md->_func_name;
  }
  std::operator<<(poVar1,pcVar2);
  return os;
}

Assistant:

inline std::ostream& operator<<(std::ostream& os, const singletons_meta_data& md)
{
    os << "singleton meta data: " << (void*)&md << " p: " << (void*)md._p << " init count: " << md._init_count
       << " flags: " << md._flags << " func name: " << (md._func_name ? md._func_name : "''");
    return os;
}